

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O1

void __thiscall iqxmlrpc::Server::push_interceptor(Server *this,Interceptor *ic)

{
  Interceptor *pIVar1;
  Impl *pIVar2;
  
  pIVar1 = (this->impl->interceptors)._M_ptr;
  (this->impl->interceptors)._M_ptr = (Interceptor *)0x0;
  boost::scoped_ptr<iqxmlrpc::Interceptor>::reset
            ((scoped_ptr<iqxmlrpc::Interceptor> *)(ic + 8),pIVar1);
  pIVar2 = this->impl;
  pIVar1 = (pIVar2->interceptors)._M_ptr;
  if (pIVar1 != ic) {
    if (pIVar1 != (Interceptor *)0x0) {
      (**(code **)(*(long *)pIVar1 + 8))();
    }
    (pIVar2->interceptors)._M_ptr = ic;
  }
  return;
}

Assistant:

void Server::push_interceptor(Interceptor* ic)
{
  ic->nest(impl->interceptors.release());
  impl->interceptors.reset(ic);
}